

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  size_type sVar5;
  pointer pBVar6;
  rep_conflict rVar7;
  string errorMessage;
  duration<long,_std::ratio<1L,_1000000000L>_> local_898;
  duration<double,_std::ratio<1L,_1L>_> local_890;
  duration<double,_std::ratio<1L,_1L>_> runningTime;
  string local_868 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848 [32];
  undefined1 local_828 [16];
  reverse_iterator it;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_810;
  int i;
  time_point finish;
  undefined1 local_720 [8];
  Solver solution;
  time_point start;
  string local_5d8 [32];
  undefined1 local_5b8 [8];
  Board board;
  string local_4c8 [32];
  ofstream local_4a8 [8];
  ofstream outputFile;
  allocator local_2a1;
  string local_2a0 [32];
  ifstream local_280 [8];
  ifstream inputFile;
  allocator local_71;
  string local_70 [32];
  int local_50;
  int algorithm;
  allocator local_39;
  string local_38 [32];
  char **local_18;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = argc;
  if (argc == 4) {
    local_50 = 0;
    iVar3 = strcmp(argv[1],"bfs");
    if (iVar3 == 0) {
      local_50 = 0;
    }
    else {
      iVar3 = strcmp(local_18[1],"dfs");
      if (iVar3 == 0) {
        local_50 = 1;
      }
      else {
        iVar3 = strcmp(local_18[1],"dijkstra");
        if (iVar3 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_70,"",&local_71);
          errorOutput((string *)local_70);
          std::__cxx11::string::~string(local_70);
          std::allocator<char>::~allocator((allocator<char> *)&local_71);
          return -1;
        }
        local_50 = 2;
      }
    }
    std::ifstream::ifstream(local_280,local_18[2],8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2a0,
                 "There was a problem with the input file, please verify that the input file is there."
                 ,&local_2a1);
      errorOutput((string *)local_2a0);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      argv_local._4_4_ = -1;
    }
    else {
      std::ofstream::ofstream(local_4a8,local_18[3],0x10);
      bVar1 = std::ofstream::is_open();
      if ((bVar1 & 1) == 0) {
        std::ifstream::close();
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_4c8,
                   "There was a problem with the output file, please verify that the output file is there."
                   ,(allocator *)
                    ((long)&board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 7));
        errorOutput((string *)local_4c8);
        std::__cxx11::string::~string(local_4c8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        argv_local._4_4_ = -1;
      }
      else {
        Board::Board((Board *)local_5b8);
        Board::populateBoard((Board *)local_5b8,local_280);
        printSeperator();
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_5d8,"Initial board state:\n",(allocator *)((long)&start.__d.__r + 7));
        Board::print((Board *)local_5b8,(string *)local_5d8);
        std::__cxx11::string::~string(local_5d8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&start.__d.__r + 7));
        solution.board.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)std::chrono::_V2::system_clock::now();
        Board::Board((Board *)&finish,(Board *)local_5b8);
        Solver::Solver((Solver *)local_720,(Board *)&finish);
        Board::~Board((Board *)&finish);
        Solver::solve((Solver *)local_720,local_50);
        tStack_810.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        printSeperator();
        poVar4 = std::operator<<((ostream *)&std::cout,"Puzzle is solved.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Number of steps to solve: ");
        poVar4 = std::operator<<(poVar4," ");
        sVar5 = std::vector<Board,_std::allocator<Board>_>::size
                          ((vector<Board,_std::allocator<Board>_> *)
                           &solution.pastSteps._M_t._M_impl.super__Rb_tree_header._M_node_count);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        printSeperator();
        it.current._M_current._4_4_ = 0;
        std::vector<Board,_std::allocator<Board>_>::rbegin
                  ((vector<Board,_std::allocator<Board>_> *)(local_828 + 8));
        while( true ) {
          std::vector<Board,_std::allocator<Board>_>::rend
                    ((vector<Board,_std::allocator<Board>_> *)local_828);
          bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<Board_*,_std::vector<Board,_std::allocator<Board>_>_>_>
                                   *)(local_828 + 8),
                                  (reverse_iterator<__gnu_cxx::__normal_iterator<Board_*,_std::vector<Board,_std::allocator<Board>_>_>_>
                                   *)local_828);
          if (!bVar2) break;
          pBVar6 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<Board_*,_std::vector<Board,_std::allocator<Board>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Board_*,_std::vector<Board,_std::allocator<Board>_>_>_>
                                 *)(local_828 + 8));
          std::__cxx11::to_string((__cxx11 *)&runningTime,it.current._M_current._4_4_);
          std::operator+((char *)local_868,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Step ");
          std::operator+(local_848,(char *)local_868);
          Board::print(pBVar6,local_848);
          std::__cxx11::string::~string((string *)local_848);
          std::__cxx11::string::~string(local_868);
          std::__cxx11::string::~string((string *)&runningTime);
          pBVar6 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<Board_*,_std::vector<Board,_std::allocator<Board>_>_>_>
                   ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<Board_*,_std::vector<Board,_std::allocator<Board>_>_>_>
                                 *)(local_828 + 8));
          Board::exportToFile(pBVar6,local_4a8);
          poVar4 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)local_4a8,std::endl<char,std::char_traits<char>>);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          it.current._M_current._4_4_ = it.current._M_current._4_4_ + 1;
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<Board_*,_std::vector<Board,_std::allocator<Board>_>_>_>
          ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<Board_*,_std::vector<Board,_std::allocator<Board>_>_>_>
                        *)(local_828 + 8));
        }
        printSeperator();
        local_898.__r =
             (rep)std::chrono::operator-
                            (&stack0xfffffffffffff7f0,
                             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&solution.board.blocks.
                                 super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
        std::chrono::duration<double,std::ratio<1l,1l>>::
        duration<long,std::ratio<1l,1000000000l>,void>
                  ((duration<double,std::ratio<1l,1l>> *)&local_890,&local_898);
        poVar4 = std::operator<<((ostream *)&std::cout,"The puzzle is solved.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "The total time in seconds the algorithm took to solve the puzzle: "
                                );
        poVar4 = std::operator<<(poVar4," ");
        rVar7 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_890);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar7);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "The total number of boards seen to find the solution including the initial state: "
                                );
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(ulong)local_720);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "The block with letter \'A\' represents the block which is asked to be rescued."
                                );
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "The output states are written to the output file you provided.");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        printSeperator();
        std::ifstream::close();
        std::ofstream::close();
        argv_local._4_4_ = 0;
        Solver::~Solver((Solver *)local_720);
        Board::~Board((Board *)local_5b8);
      }
      std::ofstream::~ofstream(local_4a8);
    }
    std::ifstream::~ifstream(local_280);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"",&local_39);
    errorOutput((string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {

    // Do not execute if the number of parameters are wrong.
    if (argc != 4) {
        errorOutput();
        return 0;
    }

    // Open the files.
    int algorithm = 0;
    if (strcmp(argv[1], "bfs") == 0) {
        algorithm = BFS;
    } else if (strcmp(argv[1], "dfs") == 0) {
        algorithm = DFS;
    } else if (strcmp(argv[1], "dijkstra") == 0) {
        algorithm = DIJKSTRA;
    } else {
        errorOutput();
        return -1;
    }

    ifstream inputFile(argv[2]);
    if (!inputFile.is_open()) {
        errorOutput("There was a problem with the input file, please verify that the input file is there.");
        return -1;
    }

    ofstream outputFile(argv[3]);
    if (!outputFile.is_open()) {
        inputFile.close();
        errorOutput("There was a problem with the output file, please verify that the output file is there.");
        return -1;
    }

    try {
        // Create and populate the board from the input file.
        Board board;
        board.populateBoard(inputFile);

        // Print the initial state of the board.
        printSeperator();
        board.print("Initial board state:\n");


        // Record start time
        auto start = chrono::high_resolution_clock::now();

        // Solve the board with the algorithm provided.
        Solver solution(board);
        solution.solve(algorithm);

        // Record end time
        auto finish = chrono::high_resolution_clock::now();

        printSeperator();
        pp("Puzzle is solved.");
        pp2("Number of steps to solve: ", solution.steps.size());
        printSeperator();

        int i = 0;
        for (vector<Board>::reverse_iterator it = solution.steps.rbegin(); it != solution.steps.rend(); ++it) {

            // Print the board to the screen.
            it->print("Step " + to_string(i) + "\n");

            // Export the board state to the output file.
            it->exportToFile(outputFile);

            // Set the spacing between different board states in the file.
            outputFile << endl << endl;
            i++;
        }

        printSeperator();
        std::chrono::duration<double> runningTime = finish - start;
        pp("The puzzle is solved.");
        pp2("The total time in seconds the algorithm took to solve the puzzle: ", runningTime.count());
        pp2("The total number of boards seen to find the solution including the initial state: ",
            solution.numberOfNodes);
        pp("The block with letter 'A' represents the block which is asked to be rescued.");
        pp("The output states are written to the output file you provided.");
        printSeperator();

        inputFile.close();
        outputFile.close();
        return 0;
    } catch (string errorMessage) {
        cerr << errorMessage << endl;
        return -1;
    }
}